

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O0

iterator __thiscall
google::protobuf::RepeatedField<long>::erase
          (RepeatedField<long> *this,const_iterator first,const_iterator last)

{
  int iVar1;
  const_iterator plVar2;
  iterator plVar3;
  long *plVar4;
  size_type first_offset;
  const_iterator last_local;
  const_iterator first_local;
  RepeatedField<long> *this_local;
  
  plVar2 = cbegin(this);
  iVar1 = (int)((long)first - (long)plVar2 >> 3);
  if (first != last) {
    plVar2 = cend(this);
    plVar3 = begin(this);
    plVar4 = std::copy<long_const*,long*>(last,plVar2,plVar3 + iVar1);
    plVar2 = cbegin(this);
    Truncate(this,(int)((long)plVar4 - (long)plVar2 >> 3));
  }
  plVar3 = begin(this);
  return plVar3 + iVar1;
}

Assistant:

inline typename RepeatedField<Element>::iterator RepeatedField<Element>::erase(
    const_iterator first, const_iterator last) {
  size_type first_offset = first - cbegin();
  if (first != last) {
    Truncate(std::copy(last, cend(), begin() + first_offset) - cbegin());
  }
  return begin() + first_offset;
}